

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZBSpStructMatrix.cpp
# Opt level: O3

int __thiscall
TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::ClassId
          (TPZBSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this
          )

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"TPZBSpStructMatrix","");
  uVar1 = Hash(&local_40);
  iVar2 = ClassId(this);
  iVar3 = TPZStructMatrixOT<std::complex<double>_>::ClassId
                    ((TPZStructMatrixOT<std::complex<double>_> *)
                     &(this->
                      super_TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                      ).super_TPZStructMatrixT<std::complex<double>_>.super_TPZStructMatrix.
                      field_0xa0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZBSpStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZBSpStructMatrix") ^
        TPZBSpStructMatrix<TVar,TPar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}